

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandComb(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  char *pcVar3;
  uint local_44;
  uint local_40;
  int nLatchesToAdd;
  int fRemoveLatches;
  int c;
  Abc_Ntk_t *pNtkRes;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  local_40 = 0;
  local_44 = 0;
  Extra_UtilGetoptReset();
  while( true ) {
    while( true ) {
      iVar1 = Extra_UtilGetopt(argc,argv,"Llh");
      if (iVar1 == -1) {
        if (pAVar2 == (Abc_Ntk_t *)0x0) {
          Abc_Print(-1,"Empty network.\n");
          return 1;
        }
        iVar1 = Abc_NtkIsComb(pAVar2);
        if ((iVar1 != 0) && (local_44 == 0)) {
          Abc_Print(-1,"The network is already combinational.\n");
          return 0;
        }
        iVar1 = Abc_NtkIsComb(pAVar2);
        if ((iVar1 == 0) && (local_44 != 0)) {
          Abc_Print(-1,"The network is already combinational.\n");
          return 0;
        }
        pAVar2 = Abc_NtkDup(pAVar2);
        if (local_44 == 0) {
          Abc_NtkMakeComb(pAVar2,local_40);
        }
        else {
          Abc_NtkMakeSeq(pAVar2,local_44);
        }
        Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
        return 0;
      }
      if (iVar1 == 0x4c) break;
      if ((iVar1 == 0x68) || (iVar1 != 0x6c)) goto LAB_00272cf3;
      local_40 = local_40 ^ 1;
    }
    if (argc <= globalUtilOptind) break;
    local_44 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = globalUtilOptind + 1;
    if ((int)local_44 < 0) {
LAB_00272cf3:
      Abc_Print(-2,"usage: comb [-L <num>] [-lh]\n");
      Abc_Print(-2,"\t           converts comb network into seq, and vice versa\n");
      Abc_Print(-2,
                "\t-L <num> : number of latches to add to comb network (0 = do not add) [default = %d]\n"
                ,(ulong)local_44);
      pcVar3 = "convert";
      if (local_40 != 0) {
        pcVar3 = "remove";
      }
      Abc_Print(-2,
                "\t-l       : toggle converting latches to PIs/POs or removing them [default = %s]\n"
                ,pcVar3);
      Abc_Print(-2,"\t-h       : print the command usage\n");
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-L\" should be followed by an integer.\n");
  goto LAB_00272cf3;
}

Assistant:

int Abc_CommandComb( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int c;
    int fRemoveLatches;
    int nLatchesToAdd;
    extern void Abc_NtkMakeSeq( Abc_Ntk_t * pNtk, int nLatchesToAdd );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    fRemoveLatches = 0;
    nLatchesToAdd = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Llh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            nLatchesToAdd = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLatchesToAdd < 0 )
                goto usage;
            break;
        case 'l':
            fRemoveLatches ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( Abc_NtkIsComb(pNtk) && nLatchesToAdd == 0 )
    {
        Abc_Print( -1, "The network is already combinational.\n" );
        return 0;
    }
    if ( !Abc_NtkIsComb(pNtk) && nLatchesToAdd != 0 )
    {
        Abc_Print( -1, "The network is already combinational.\n" );
        return 0;
    }

    // get the new network
    pNtkRes = Abc_NtkDup( pNtk );
    if ( nLatchesToAdd )
        Abc_NtkMakeSeq( pNtkRes, nLatchesToAdd );
    else
        Abc_NtkMakeComb( pNtkRes, fRemoveLatches );
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: comb [-L <num>] [-lh]\n" );
    Abc_Print( -2, "\t           converts comb network into seq, and vice versa\n" );
    Abc_Print( -2, "\t-L <num> : number of latches to add to comb network (0 = do not add) [default = %d]\n", nLatchesToAdd );
    Abc_Print( -2, "\t-l       : toggle converting latches to PIs/POs or removing them [default = %s]\n", fRemoveLatches? "remove": "convert" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}